

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eliminate_dead_io_components_pass.cpp
# Opt level: O3

void __thiscall
spvtools::opt::EliminateDeadIOComponentsPass::ChangeArrayLength
          (EliminateDeadIOComponentsPass *this,Instruction *arr_var,uint length)

{
  TypeManager *this_00;
  ConstantManager *this_01;
  DefUseManager *this_02;
  Analysis AVar1;
  uint32_t uVar2;
  int iVar3;
  Type *pTVar4;
  undefined4 extraout_var;
  Array *this_03;
  IRContext *pIVar5;
  IRContext *this_04;
  Array new_arr_ty;
  Pointer new_ptr_ty;
  Array local_e0;
  undefined1 local_90 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_70;
  Pointer local_68;
  
  pIVar5 = (this->super_Pass).context_;
  AVar1 = pIVar5->valid_analyses_;
  this_04 = pIVar5;
  if (-1 < (short)AVar1) {
    IRContext::BuildTypeManager(pIVar5);
    this_04 = (this->super_Pass).context_;
    AVar1 = this_04->valid_analyses_;
  }
  this_00 = (pIVar5->type_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>._M_head_impl;
  pIVar5 = this_04;
  if ((AVar1 >> 0xe & 1) == 0) {
    IRContext::BuildConstantManager(this_04);
    pIVar5 = (this->super_Pass).context_;
    AVar1 = pIVar5->valid_analyses_;
  }
  this_01 = (this_04->constant_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::ConstantManager,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::ConstantManager_*,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::ConstantManager_*,_false>._M_head_impl;
  if ((AVar1 & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar5);
  }
  this_02 = (pIVar5->def_use_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  uVar2 = 0;
  if (arr_var->has_type_id_ == true) {
    uVar2 = Instruction::GetSingleWordOperand(arr_var,0);
  }
  pTVar4 = analysis::TypeManager::GetType(this_00,uVar2);
  iVar3 = (*pTVar4->_vptr_Type[0x1f])(pTVar4);
  this_03 = (Array *)(**(code **)(**(long **)(CONCAT44(extraout_var,iVar3) + 0x28) + 0xc0))();
  if (this_03 != (Array *)0x0) {
    uVar2 = analysis::ConstantManager::GetUIntConstId(this_01,length);
    pTVar4 = this_03->element_type_;
    analysis::Array::GetConstantLengthInfo((LengthInfo *)&local_68,this_03,uVar2,length);
    analysis::Array::Array(&local_e0,pTVar4,(LengthInfo *)&local_68);
    if (local_68.super_Type.decorations_.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.super_Type.decorations_.
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_68.super_Type.decorations_.
                            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.super_Type.decorations_.
                            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    pTVar4 = analysis::TypeManager::GetRegisteredType(this_00,&local_e0.super_Type);
    analysis::Pointer::Pointer
              (&local_68,pTVar4,*(StorageClass *)(CONCAT44(extraout_var,iVar3) + 0x30));
    pTVar4 = analysis::TypeManager::GetRegisteredType(this_00,&local_68.super_Type);
    local_90._16_4_ = analysis::TypeManager::GetTypeInstruction(this_00,pTVar4);
    if (arr_var->has_type_id_ != false) {
      if ((_Type)local_90._16_4_ != (_Type)0x0) {
        local_90._24_8_ = local_90 + 0x10;
        local_90._0_8_ = &PTR__SmallVector_003d7c78;
        local_70._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
        local_90._8_8_ = 1;
        utils::SmallVector<unsigned_int,_2UL>::operator=
                  (&((arr_var->operands_).
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_start)->words,
                   (SmallVector<unsigned_int,_2UL> *)local_90);
        local_90._0_8_ = &PTR__SmallVector_003d7c78;
        if (local_70._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
          std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                    ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                     &local_70,local_70._M_head_impl);
        }
        analysis::DefUseManager::AnalyzeInstUse(this_02,arr_var);
        local_68.super_Type._vptr_Type = (_func_int **)&PTR__Type_003d7f68;
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::~vector(&local_68.super_Type.decorations_);
        local_e0.super_Type._vptr_Type = (_func_int **)&PTR__Array_003daa98;
        if (local_e0.length_info_.words.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_e0.length_info_.words.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_e0.length_info_.words.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_e0.length_info_.words.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        local_e0.super_Type._vptr_Type = (_func_int **)&PTR__Type_003d7f68;
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::~vector(&local_e0.super_Type.decorations_);
        return;
      }
      __assert_fail("ty_id != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h"
                    ,0x2e3,"void spvtools::opt::Instruction::SetResultType(uint32_t)");
    }
    __assert_fail("has_type_id_",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h"
                  ,0x2de,"void spvtools::opt::Instruction::SetResultType(uint32_t)");
  }
  __assert_fail("arr_ty && \"expecting array type\"",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/eliminate_dead_io_components_pass.cpp"
                ,0xc5,
                "void spvtools::opt::EliminateDeadIOComponentsPass::ChangeArrayLength(Instruction &, unsigned int)"
               );
}

Assistant:

void EliminateDeadIOComponentsPass::ChangeArrayLength(Instruction& arr_var,
                                                      unsigned length) {
  analysis::TypeManager* type_mgr = context()->get_type_mgr();
  analysis::ConstantManager* const_mgr = context()->get_constant_mgr();
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  analysis::Pointer* ptr_type =
      type_mgr->GetType(arr_var.type_id())->AsPointer();
  const analysis::Array* arr_ty = ptr_type->pointee_type()->AsArray();
  assert(arr_ty && "expecting array type");
  uint32_t length_id = const_mgr->GetUIntConstId(length);
  analysis::Array new_arr_ty(arr_ty->element_type(),
                             arr_ty->GetConstantLengthInfo(length_id, length));
  analysis::Type* reg_new_arr_ty = type_mgr->GetRegisteredType(&new_arr_ty);
  analysis::Pointer new_ptr_ty(reg_new_arr_ty, ptr_type->storage_class());
  analysis::Type* reg_new_ptr_ty = type_mgr->GetRegisteredType(&new_ptr_ty);
  uint32_t new_ptr_ty_id = type_mgr->GetTypeInstruction(reg_new_ptr_ty);
  arr_var.SetResultType(new_ptr_ty_id);
  def_use_mgr->AnalyzeInstUse(&arr_var);
}